

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O2

void time_map_fetch<EasyUseMap<HashObject<16,16>,int>>
               (int iters,vector<int,_std::allocator<int>_> *indices,char *title)

{
  uint *puVar1;
  iterator iVar2;
  size_t in_RCX;
  size_t start_memory;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  double t_00;
  Rusage t;
  key_type local_78;
  char *local_68;
  EasyUseMap<HashObject<16,_16>,_int> set;
  
  set.
  super_map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &set.
        super_map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_header;
  set.
  super_map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  set.
  super_map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  set.
  super_map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68 = title;
  set.
  super_map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       set.
       super_map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
       ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Rusage::Rusage(&t);
  uVar5 = 0;
  uVar3 = 0;
  if (0 < iters) {
    uVar3 = iters;
  }
  while (uVar3 != uVar5) {
    local_78.buffer_._0_8_ = (ulong)(uVar5 & 0xff) * 0x101010101010101;
    local_78.buffer_._8_4_ = SUB84(local_78.buffer_._0_8_,0);
    local_78.i_ = uVar5;
    puVar1 = (uint *)std::
                     map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                     ::operator[](&set.
                                   super_map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                                  ,&local_78);
    uVar5 = uVar5 + 1;
    *puVar1 = uVar5;
  }
  Rusage::Reset(&t);
  uVar5 = 1;
  for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    local_78.i_ = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar4];
    local_78.buffer_._0_8_ = (ulong)(local_78.i_ & 0xff) * 0x101010101010101;
    local_78.buffer_._8_4_ = SUB84(local_78.buffer_._0_8_,0);
    iVar2 = std::
            _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
            ::find((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                    *)&set,&local_78);
    bVar6 = (_Rb_tree_header *)iVar2._M_node !=
            &set.
             super_map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
             ._M_t._M_impl.super__Rb_tree_header;
    in_RCX = (size_t)bVar6;
    uVar5 = uVar5 ^ bVar6;
  }
  t_00 = Rusage::UserTime(&t);
  srand(uVar5);
  report(local_68,t_00,iters,start_memory,in_RCX);
  std::
  _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
               *)&set);
  return;
}

Assistant:

static void time_map_fetch(int iters, const vector<int>& indices,
                           char const* title) {
  MapType set;
  Rusage t;
  int r;
  int i;

  for (i = 0; i < iters; i++) {
    set[i] = i + 1;
  }

  r = 1;
  t.Reset();
  for (i = 0; i < iters; i++) {
    r ^= static_cast<int>(set.find(indices[i]) != set.end());
  }
  double ut = t.UserTime();

  srand(r);  // keep compiler from optimizing away r (we never call rand())
  report(title, ut, iters, 0, 0);
}